

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  
  for (sVar8 = 0; sVar8 != n_commands; sVar8 = sVar8 + 1) {
    uVar10 = commands[sVar8].insert_len_;
    uVar12 = (ulong)uVar10;
    uVar11 = commands[sVar8].copy_len_;
    uVar2 = commands[sVar8].cmd_prefix_;
    bVar1 = cmd_depth[uVar2];
    uVar15 = *storage_ix;
    uVar4 = commands[sVar8].dist_extra_;
    uVar3 = commands[sVar8].dist_prefix_;
    *(ulong *)(storage + (uVar15 >> 3)) =
         (ulong)cmd_bits[uVar2] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
    uVar15 = bVar1 + uVar15;
    *storage_ix = uVar15;
    uVar13 = uVar10;
    if (5 < uVar12) {
      if (uVar10 < 0x82) {
        uVar13 = 0x1f;
        uVar17 = (uint)(uVar12 - 2);
        if (uVar17 != 0) {
          for (; uVar17 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        iVar9 = (uVar13 ^ 0xffffffe0) + 0x1f;
        uVar13 = (int)(uVar12 - 2 >> ((byte)iVar9 & 0x3f)) + iVar9 * 2 + 2;
      }
      else if (uVar10 < 0x842) {
        uVar13 = 0x1f;
        if (uVar10 - 0x42 != 0) {
          for (; uVar10 - 0x42 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = (uVar13 ^ 0xffffffe0) + 0x2a;
      }
      else {
        uVar13 = 0x15;
        if (0x1841 < uVar10) {
          uVar13 = 0x17 - (uVar10 < 0x5842);
        }
      }
    }
    bVar1 = (byte)(uVar11 >> 0x18);
    uVar11 = uVar11 & 0x1ffffff;
    uVar17 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + uVar11;
    if (uVar17 < 10) {
      uVar6 = uVar17 + 0xfffe;
    }
    else if (uVar17 < 0x86) {
      uVar6 = 0x1f;
      uVar14 = (uint)((ulong)uVar17 - 6);
      if (uVar14 != 0) {
        for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      iVar9 = (uVar6 ^ 0xffffffe0) + 0x1f;
      uVar6 = (int)((ulong)uVar17 - 6 >> ((byte)iVar9 & 0x3f)) + iVar9 * 2 + 4;
    }
    else {
      uVar6 = 0x17;
      if (uVar17 < 0x846) {
        uVar6 = 0x1f;
        if (uVar17 - 0x46 != 0) {
          for (; uVar17 - 0x46 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = (uVar6 ^ 0xffffffe0) + 0x2c;
      }
    }
    uVar14 = (uVar13 & 0xffff) << 2;
    iVar9 = *(int *)(duckdb_brotli::kBrotliInsExtra + uVar14);
    uVar13 = (uVar6 & 0xffff) << 2;
    iVar5 = *(int *)(duckdb_brotli::kBrotliCopyExtra + uVar13);
    *(ulong *)(storage + (uVar15 >> 3)) =
         ((ulong)(uVar17 - *(int *)(duckdb_brotli::kBrotliCopyBase + uVar13)) <<
          ((byte)iVar9 & 0x3f) | (ulong)(uVar10 - *(int *)(duckdb_brotli::kBrotliInsBase + uVar14)))
         << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
    uVar15 = (uint)(iVar9 + iVar5) + uVar15;
    *storage_ix = uVar15;
    uVar7 = start_pos;
    for (lVar16 = 0; -lVar16 != uVar12; lVar16 = lVar16 + -1) {
      bVar1 = lit_depth[input[uVar7 & mask]];
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)lit_bits[input[uVar7 & mask]] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      uVar15 = uVar15 + bVar1;
      *storage_ix = uVar15;
      uVar7 = uVar7 + 1;
    }
    if ((uVar11 != 0) && (0x7f < uVar2)) {
      uVar10 = uVar3 & 0x3ff;
      bVar1 = dist_depth[uVar10];
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)dist_bits[uVar10] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      uVar15 = bVar1 + uVar15;
      *storage_ix = uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)uVar4 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar15 + (uVar3 >> 10);
    }
    start_pos = (start_pos + uVar11) - lVar16;
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command* commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_ & 0x3FF;
      const uint32_t distnumextra = cmd.dist_prefix_ >> 10;
      const uint32_t distextra = cmd.dist_extra_;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}